

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

void __thiscall duckdb_re2::SparseArray<int>::~SparseArray(SparseArray<int> *this)

{
  IndexValue *pIVar1;
  int *piVar2;
  
  pIVar1 = (this->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if (pIVar1 != (IndexValue *)0x0) {
    operator_delete(pIVar1);
  }
  (this->dense_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl =
       (IndexValue *)0x0;
  piVar2 = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
           _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar2 != (int *)0x0) {
    operator_delete(piVar2);
  }
  (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
  return;
}

Assistant:

SparseArray<Value>::~SparseArray() {
  DebugCheckInvariants();
}